

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<ImGuiWindow_*>::push_front(ImVector<ImGuiWindow_*> *this,ImGuiWindow **v)

{
  int *piVar1;
  ImGuiWindow **ppIVar2;
  uint uVar3;
  ImGuiWindow **ppIVar4;
  long lVar5;
  int iVar6;
  
  uVar3 = this->Size;
  if (uVar3 == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar4 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0x40,GImAllocatorUserData);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(ppIVar4,this->Data,(long)this->Size << 3);
        ppIVar2 = this->Data;
        if ((ppIVar2 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      this->Data = ppIVar4;
      this->Capacity = 8;
      lVar5 = (long)this->Size;
    }
    else {
      ppIVar4 = this->Data;
      lVar5 = 0;
    }
    ppIVar4 = ppIVar4 + lVar5;
  }
  else {
    if (uVar3 == this->Capacity) {
      iVar6 = (int)uVar3 / 2 + uVar3;
      if (iVar6 <= (int)(uVar3 + 1)) {
        iVar6 = uVar3 + 1;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar4 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar6 << 3,GImAllocatorUserData);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(ppIVar4,this->Data,(long)this->Size << 3);
        ppIVar2 = this->Data;
        if ((ppIVar2 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      this->Data = ppIVar4;
      this->Capacity = iVar6;
      uVar3 = this->Size;
    }
    else {
      ppIVar4 = this->Data;
    }
    if (0 < (int)uVar3) {
      memmove(ppIVar4 + 1,ppIVar4,(ulong)uVar3 << 3);
      ppIVar4 = this->Data;
    }
  }
  *ppIVar4 = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }